

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trodesmsg.cpp
# Opt level: O2

void __thiscall
TrodesMsg::processArg
          (TrodesMsg *this,char c,vector<unsigned_char,_std::allocator<unsigned_char>_> *a)

{
  pointer puVar1;
  zframe_t *self;
  size_t sVar2;
  byte *__src;
  string *this_00;
  allocator local_21;
  zframe_t *fr;
  
  if (c == 'b') {
    self = zmsg_pop(this->msg);
    puVar1 = (a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
             super__Vector_impl_data._M_start;
    if ((a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
        super__Vector_impl_data._M_finish != puVar1) {
      (a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
      super__Vector_impl_data._M_finish = puVar1;
    }
    fr = self;
    if (self != (zframe_t *)0x0) {
      sVar2 = zframe_size(self);
      if (sVar2 != 0) {
        sVar2 = zframe_size(self);
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::resize(a,sVar2);
      }
      puVar1 = (a->super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>)._M_impl.
               super__Vector_impl_data._M_start;
      __src = zframe_data(self);
      sVar2 = zframe_size(self);
      memcpy(puVar1,__src,sVar2);
    }
    zframe_destroy(&fr);
    return;
  }
  this_00 = (string *)__cxa_allocate_exception(0x20);
  std::__cxx11::string::string
            (this_00,"Could not read message. Expected different type, got byte vector",&local_21);
  __cxa_throw(this_00,&std::__cxx11::string::typeinfo,std::__cxx11::string::~string);
}

Assistant:

void TrodesMsg::processArg(const char c, std::vector<byte> &a){
    if(c != 'b') throw std::string(PROCESSERROR "byte vector");
    zframe_t *fr = zmsg_pop(msg);
    a.clear();
    if(fr){
        if(a.size() != zframe_size(fr))
            a.resize(zframe_size(fr));
        memcpy(a.data(), zframe_data(fr), zframe_size(fr));
    }
    zframe_destroy(&fr);
}